

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::FormattingScene::Scale(FormattingScene *this,Float sx,Float sy,Float sz,FileLoc loc)

{
  Float local_4c;
  Float local_48;
  Float local_44;
  string local_40;
  
  local_4c = sz;
  local_48 = sy;
  local_44 = sx;
  indent_abi_cxx11_(&local_40,this,0);
  Printf<std::__cxx11::string,float&,float&,float&>
            ("%sScale %f %f %f\n",&local_40,&local_44,&local_48,&local_4c);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void FormattingScene::Scale(Float sx, Float sy, Float sz, FileLoc loc) {
    Printf("%sScale %f %f %f\n", indent(), sx, sy, sz);
}